

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::addObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *name,
          shared_ptr<helics::Core> *obj,CoreType type)

{
  initializer_list<helics::CoreType> __l;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>
  _Var1;
  allocator_type *this_00;
  undefined4 in_ECX;
  undefined1 uVar2;
  vector<helics::CoreType,_std::allocator<helics::CoreType>_> *in_RDX;
  allocator_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_bool>
  pVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_bool>
  res;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
  *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff58;
  allocator<helics::CoreType> local_85;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  _Base_ptr local_58;
  undefined1 local_50;
  _Base_ptr local_38;
  byte local_30;
  undefined4 local_1c;
  
  local_1c = in_ECX;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
             in_stack_ffffffffffffff18);
  pVar3 = std::
          map<std::__cxx11::string,std::shared_ptr<helics::Core>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<helics::Core>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<helics::Core>>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                     (shared_ptr<helics::Core> *)
                     CONCAT17(in_stack_ffffffffffffff27,
                              CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  _Var1 = pVar3.first._M_node;
  uVar2 = pVar3.second;
  local_58 = _Var1._M_node;
  local_50 = uVar2;
  local_38 = _Var1._M_node;
  local_30 = uVar2;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this_00 = in_RDI + 0x58;
    local_84 = local_1c;
    local_80 = &local_84;
    local_78 = 1;
    std::allocator<helics::CoreType>::allocator((allocator<helics::CoreType> *)0x4318a7);
    __l._M_array._7_1_ = uVar2;
    __l._M_array._0_7_ = in_stack_ffffffffffffff58;
    __l._M_len = (size_type)_Var1._M_node;
    std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>::vector(in_RDX,__l,in_RDI);
    std::
    map<std::__cxx11::string,std::vector<helics::CoreType,std::allocator<helics::CoreType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>>>
    ::
    emplace<std::__cxx11::string_const&,std::vector<helics::CoreType,std::allocator<helics::CoreType>>>
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>_>_>_>
                *)this_00,in_stack_ffffffffffffff28,
               (vector<helics::CoreType,_std::allocator<helics::CoreType>_> *)
               CONCAT17(in_stack_ffffffffffffff27,
                        CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
    std::vector<helics::CoreType,_std::allocator<helics::CoreType>_>::~vector
              ((vector<helics::CoreType,_std::allocator<helics::CoreType>_> *)this_00);
    std::allocator<helics::CoreType>::~allocator(&local_85);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x431977);
  return (bool)(local_30 & 1);
}

Assistant:

bool addObject(const std::string& name, std::shared_ptr<X> obj, Y type)
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto res = objectMap.emplace(name, std::move(obj));
        if (res.second) {
            typeMap.emplace(name, std::vector<Y>{type});
        }
        return res.second;
    }